

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ViewTest::shiftOperatorTest<true,(andres::CoordinateOrder)1>(ViewTest *this)

{
  int iVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_02;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_03;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_04;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_05;
  reference piVar2;
  size_t x_1;
  int *data;
  size_t y;
  size_t sVar3;
  size_t x;
  size_t sVar4;
  size_t args_1;
  CoordinateOrder local_298;
  allocator_type local_291;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  View<int,_true,_std::allocator<unsigned_long>_> w8;
  View<int,_true,_std::allocator<unsigned_long>_> w6;
  View<int,_true,_std::allocator<unsigned_long>_> w5;
  View<int,_true,_std::allocator<unsigned_long>_> w4;
  View<int,_true,_std::allocator<unsigned_long>_> w3;
  View<int,_true,_std::allocator<unsigned_long>_> w2;
  View<int,_true,_std::allocator<unsigned_long>_> w1;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,2,(allocator_type *)&v);
  begin._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  *begin._M_current = 6;
  begin._M_current[1] = 4;
  data = this->data_;
  w1.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,begin,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w2);
  begin_00._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_00._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w2.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w1,begin_00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w2,&andres::defaultOrder,
             (allocator_type *)&w3);
  begin_01._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_01._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w3.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w2,begin_01,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&w4);
  begin_02._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_02._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w4.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w3,begin_02,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w4,&andres::defaultOrder,
             (allocator_type *)&w5);
  begin_03._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_03._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w5.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w4,begin_03,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w5,&andres::defaultOrder,
             (allocator_type *)&w6);
  begin_04._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_04._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w6.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w5,begin_04,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w6,&andres::defaultOrder,
             (allocator_type *)&w8);
  begin_05._M_current._4_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  begin_05._M_current._0_4_ =
       shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  w8.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w6,begin_05,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w8,&andres::defaultOrder,
             (allocator_type *)&shape_1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w1,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w2,2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w3,3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w4,-1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w5,-2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w6,-3);
  for (sVar4 = 0; sVar4 != 6; sVar4 = sVar4 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w1,sVar3,sVar4);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w2,sVar4,sVar3);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w3,sVar3,sVar4);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w4,sVar3,sVar4);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w5,sVar4,sVar3);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3);
      iVar1 = *piVar2;
      piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)&w6,sVar3,sVar4);
      w8.data_._0_1_ = iVar1 == *piVar2;
      test((bool *)&w8);
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w6.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w5.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w4.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w3.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&shape);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_1,3,(allocator_type *)&v);
  *shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 4;
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 2;
  w1.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w1,&andres::defaultOrder,
             (allocator_type *)&w2);
  w2.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w2,&andres::defaultOrder,
             (allocator_type *)&w3);
  w3.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w3,&andres::defaultOrder,
             (allocator_type *)&w4);
  w4.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w4,&andres::defaultOrder,
             (allocator_type *)&w5);
  w5.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w5,&andres::defaultOrder,
             (allocator_type *)&w6);
  w6.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w5,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w6,&andres::defaultOrder,
             (allocator_type *)&shape);
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w6,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&shape,
             &andres::defaultOrder,(allocator_type *)&w8);
  w8.data_._0_4_ = 1;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&shape,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,(CoordinateOrder *)&w8,&andres::defaultOrder,
             (allocator_type *)&local_298);
  local_298 = LastMajorOrder;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&w8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,data,&local_298,&andres::defaultOrder,&local_291);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w1,1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w2,2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w3,3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w4,4);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w5,-1);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w6,-2);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift
            ((View<int,_true,_std::allocator<unsigned_long>_> *)&shape,-3);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::shift(&w8,-4);
  for (sVar4 = 0; sVar4 != 3; sVar4 = sVar4 + 1) {
    for (sVar3 = 0; sVar3 != 4; sVar3 = sVar3 + 1) {
      for (args_1 = 0; args_1 != 2; args_1 = args_1 + 1) {
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w1,args_1,sVar4,sVar3);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w2,sVar3,args_1,sVar4);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w3,sVar4,sVar3,args_1);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w4,args_1,sVar4,sVar3);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w5,sVar3,args_1,sVar4);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w6,args_1,sVar4,sVar3);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&shape,sVar4,sVar3,
                            args_1);
        local_298._0_1_ = iVar1 == *piVar2;
        test((bool *)&local_298);
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&v,sVar4,sVar3,args_1);
        iVar1 = *piVar2;
        piVar2 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)&w8,sVar3,args_1,sVar4);
        local_298 = CONCAT31(local_298._1_3_,iVar1 == *piVar2);
        test((bool *)&local_298);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w8.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry
            ((Geometry<std::allocator<unsigned_long>_> *)
             &shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w6.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w5.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w4.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w3.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w2.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w1.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void ViewTest::shiftOperatorTest() {
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6; 
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(-1);
        w5.shift(-2);
        w6.shift(-3);

        for(std::size_t x=0; x<6; ++x) {
            for(std::size_t y=0; y<4; ++y) {
                test(v(x, y) == w1(y, x));
                test(v(x, y) == w2(x, y));
                test(v(x, y) == w3(y, x));
                test(v(x, y) == w4(y, x));
                test(v(x, y) == w5(x, y));
                test(v(x, y) == w6(y, x));
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3; 
        shape[1] = 4;
        shape[2] = 2;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w1(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w2(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w3(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w4(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w5(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w6(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w7(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        andres::View<int, constTarget> w8(shape.begin(), shape.end(), data_, internalFirstMajorOrder);
        w1.shift(1);
        w2.shift(2);
        w3.shift(3);
        w4.shift(4);
        w5.shift(-1);
        w6.shift(-2);
        w7.shift(-3);
        w8.shift(-4);

        for(std::size_t x=0; x<3; ++x) {
            for(std::size_t y=0; y<4; ++y) {

                for(std::size_t z=0; z<2; ++z) {
                    test(v(x, y, z) == w1(z, x, y));
                    test(v(x, y, z) == w2(y, z, x));
                    test(v(x, y, z) == w3(x, y, z));
                    test(v(x, y, z) == w4(z, x, y));
                    test(v(x, y, z) == w5(y, z, x));
                    test(v(x, y, z) == w6(z, x, y));
                    test(v(x, y, z) == w7(x, y, z));
                    test(v(x, y, z) == w8(y, z, x));
                }
            }
        }
    }
}